

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void hadamard_lp_8x8_sse2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  longlong *plVar1;
  __m128i src [8];
  
  src[0][0] = *(longlong *)src_diff;
  src[0][1] = *(longlong *)(src_diff + 4);
  plVar1 = (longlong *)(src_diff + src_stride);
  src[1][0] = *plVar1;
  src[1][1] = plVar1[1];
  plVar1 = (longlong *)((long)plVar1 + src_stride * 2);
  src[2][0] = *plVar1;
  src[2][1] = plVar1[1];
  plVar1 = (longlong *)((long)plVar1 + src_stride * 2);
  src[3][0] = *plVar1;
  src[3][1] = plVar1[1];
  plVar1 = (longlong *)((long)plVar1 + src_stride * 2);
  src[4][0] = *plVar1;
  src[4][1] = plVar1[1];
  plVar1 = (longlong *)((long)plVar1 + src_stride * 2);
  src[5][0] = *plVar1;
  src[5][1] = plVar1[1];
  plVar1 = (longlong *)((long)plVar1 + src_stride * 2);
  src[6][0] = *plVar1;
  src[6][1] = plVar1[1];
  plVar1 = (longlong *)((long)plVar1 + src_stride * 2);
  src[7][0] = *plVar1;
  src[7][1] = plVar1[1];
  hadamard_col8_sse2(src,0);
  hadamard_col8_sse2(src,1);
  *(longlong *)coeff = src[0][0];
  *(longlong *)(coeff + 4) = src[0][1];
  *(longlong *)(coeff + 8) = src[1][0];
  *(longlong *)(coeff + 0xc) = src[1][1];
  *(longlong *)(coeff + 0x10) = src[2][0];
  *(longlong *)(coeff + 0x14) = src[2][1];
  *(longlong *)(coeff + 0x18) = src[3][0];
  *(longlong *)(coeff + 0x1c) = src[3][1];
  *(longlong *)(coeff + 0x20) = src[4][0];
  *(longlong *)(coeff + 0x24) = src[4][1];
  *(longlong *)(coeff + 0x28) = src[5][0];
  *(longlong *)(coeff + 0x2c) = src[5][1];
  *(longlong *)(coeff + 0x30) = src[6][0];
  *(longlong *)(coeff + 0x34) = src[6][1];
  *(longlong *)(coeff + 0x38) = src[7][0];
  *(longlong *)(coeff + 0x3c) = src[7][1];
  return;
}

Assistant:

static inline void hadamard_lp_8x8_sse2(const int16_t *src_diff,
                                        ptrdiff_t src_stride, int16_t *coeff) {
  __m128i src[8];
  src[0] = _mm_load_si128((const __m128i *)src_diff);
  src[1] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[2] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[3] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[4] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[5] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[6] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[7] = _mm_load_si128((const __m128i *)(src_diff + src_stride));

  hadamard_col8_sse2(src, 0);
  hadamard_col8_sse2(src, 1);

  _mm_store_si128((__m128i *)coeff, src[0]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[1]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[2]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[3]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[4]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[5]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[6]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[7]);
}